

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O0

void apx_port_destroy(apx_port_t *self)

{
  apx_port_t *self_local;
  
  if (self != (apx_port_t *)0x0) {
    apx_dataSignature_destroy(&self->data_signature);
    if (self->name != (char *)0x0) {
      free(self->name);
    }
    if (self->proper_init_value != (dtl_dv_t *)0x0) {
      dtl_dv_dec_ref(self->proper_init_value);
    }
    if (self->attributes != (apx_portAttributes_t *)0x0) {
      apx_portAttributes_delete(self->attributes);
    }
  }
  return;
}

Assistant:

void apx_port_destroy(apx_port_t* self)
{
   if (self != NULL)
   {
      apx_dataSignature_destroy(&self->data_signature);
      if (self->name != NULL)
      {
         free(self->name);
      }
      if (self->proper_init_value != NULL)
      {
         dtl_dec_ref(self->proper_init_value);
      }
      if (self->attributes != NULL)
      {
         apx_portAttributes_delete(self->attributes);
      }
   }
}